

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etcdec.cxx
# Opt level: O3

void decompressBlockDifferentialWithAlphaC
               (uint block_part1,uint block_part2,uint8 *img,uint8 *alpha,int width,int height,
               int startx,int starty,int channelsRGB)

{
  bool bVar1;
  sbyte sVar2;
  uint uVar3;
  uint uVar4;
  uint8 *puVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  uint8 *puVar9;
  uint uVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  long lVar14;
  byte bVar15;
  byte bVar16;
  uint uVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  uint8 *puVar24;
  int iVar25;
  int iVar26;
  uint uVar27;
  long local_78;
  
  lVar14 = (long)channelsRGB;
  puVar5 = img + 3;
  if (lVar14 == 3) {
    puVar5 = alpha;
  }
  uVar20 = block_part1 >> 1;
  uVar27 = block_part1 >> 0x13 & 0x1f;
  uVar3 = (block_part1 >> 0x1b) << 3 | block_part1 >> 0x1d;
  uVar19 = block_part1 >> 0xb & 0x1f;
  uVar4 = block_part1 >> 4 & 0xe;
  uVar21 = block_part2 & 0xffff;
  uVar17 = block_part2 >> 0x10;
  sVar2 = (lVar14 != 3) * '\x02';
  iVar25 = (uVar27 >> 2) + uVar27 * 8;
  iVar26 = (uVar19 >> 2) + uVar19 * 8;
  lVar23 = (long)starty;
  lVar18 = (long)width;
  local_78 = (long)startx;
  if ((block_part1 & 1) == 0) {
    iVar8 = starty * width + startx;
    puVar9 = img + (lVar23 * lVar18 + local_78) * lVar14 + 2;
    bVar15 = 0;
    lVar7 = lVar23 + -1;
    iVar13 = iVar8;
    puVar24 = puVar9;
    lVar6 = local_78;
    do {
      do {
        uVar10 = uVar21 >> (bVar15 & 0x1f);
        uVar22 = (uVar10 & 1) + (uVar17 >> (bVar15 & 0x1f) & 1) * 2;
        uVar10 = -((uVar10 | uVar20) & 1) &
                 *(uint *)((long)compressParams[0] +
                          (long)unscramble[uVar22] * 4 + (ulong)(uVar4 << 4));
        iVar11 = uVar10 + uVar3;
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        puVar9[-2] = (uint8)iVar11;
        iVar11 = uVar10 + iVar25;
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        puVar9[-1] = (uint8)iVar11;
        iVar11 = uVar10 + iVar26;
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        iVar12 = iVar8 << sVar2;
        *puVar9 = (uint8)iVar11;
        if (((uVar20 & 1) == 0) && (uVar22 == 2)) {
          puVar5[iVar12] = '\0';
          puVar9[-2] = '\0';
          puVar9[-1] = '\0';
          *puVar9 = '\0';
        }
        else {
          puVar5[iVar12] = 0xff;
        }
        lVar7 = lVar7 + 1;
        iVar8 = iVar8 + width;
        puVar9 = puVar9 + lVar14 * lVar18;
        bVar15 = bVar15 + 1;
      } while (lVar7 < starty + 3);
      iVar8 = iVar13 + 1;
      puVar9 = puVar24 + lVar14;
      bVar1 = lVar6 <= local_78;
      lVar7 = lVar23 + -1;
      iVar13 = iVar8;
      puVar24 = puVar9;
      lVar6 = lVar6 + 1;
    } while (bVar1);
  }
  else {
    iVar13 = starty * width + startx;
    puVar9 = img + (lVar23 * lVar18 + local_78) * lVar14 + 2;
    lVar7 = lVar23 + -1;
    bVar15 = 0;
    puVar24 = puVar9;
    iVar8 = iVar13;
    do {
      do {
        bVar16 = bVar15;
        uVar10 = uVar21 >> (bVar16 & 0x1f);
        uVar22 = (uVar10 & 1) + (uVar17 >> (bVar16 & 0x1f) & 1) * 2;
        uVar10 = -((uVar10 | uVar20) & 1) &
                 *(uint *)((long)compressParams[0] +
                          (long)unscramble[uVar22] * 4 + (ulong)(uVar4 << 4));
        iVar11 = uVar10 + uVar3;
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        puVar9[-2] = (uint8)iVar11;
        iVar11 = uVar10 + iVar25;
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        puVar9[-1] = (uint8)iVar11;
        iVar11 = uVar10 + iVar26;
        if (0xfe < iVar11) {
          iVar11 = 0xff;
        }
        if (iVar11 < 1) {
          iVar11 = 0;
        }
        iVar12 = iVar13 << sVar2;
        *puVar9 = (uint8)iVar11;
        if (((uVar20 & 1) == 0) && (uVar22 == 2)) {
          puVar5[iVar12] = '\0';
          puVar9[-2] = '\0';
          puVar9[-1] = '\0';
          *puVar9 = '\0';
        }
        else {
          puVar5[iVar12] = 0xff;
        }
        lVar7 = lVar7 + 1;
        iVar13 = iVar13 + width;
        puVar9 = puVar9 + lVar14 * lVar18;
        bVar15 = bVar16 + 1;
      } while (lVar7 <= lVar23);
      iVar13 = iVar8 + 1;
      puVar9 = puVar24 + lVar14;
      bVar1 = local_78 < startx + 3;
      lVar7 = lVar23 + -1;
      bVar15 = bVar16 + 3;
      local_78 = local_78 + 1;
      puVar24 = puVar9;
      iVar8 = iVar13;
    } while (bVar1);
  }
  uVar3 = ((int)(block_part1 << 5) >> 0x1d) + (block_part1 >> 0x1b);
  uVar27 = uVar27 + ((int)(block_part1 << 0xd) >> 0x1d);
  uVar19 = uVar19 + ((int)(block_part1 << 0x15) >> 0x1d);
  uVar4 = uVar3 * 8 & 0xff | (uVar3 & 0xff) >> 2;
  uVar27 = uVar27 * 8 & 0xff | (uVar27 & 0xff) >> 2;
  uVar3 = uVar19 * 8 & 0xff | (uVar19 & 0xff) >> 2;
  sVar2 = (channelsRGB != 3) * '\x02';
  lVar14 = (long)channelsRGB;
  if ((block_part1 & 1) == 0) {
    iVar26 = startx + starty * width + 2;
    puVar9 = img + (lVar23 * lVar18 + (long)(startx + 2)) * lVar14 + 2;
    bVar15 = 8;
    lVar7 = lVar23 + -1;
    puVar24 = puVar9;
    lVar6 = (long)(startx + 2);
    iVar25 = iVar26;
    do {
      do {
        uVar22 = uVar21 >> (bVar15 & 0x1f);
        uVar19 = (uVar22 & 1) + (uVar17 >> (bVar15 & 0x1f) & 1) * 2;
        uVar22 = -((uVar22 | uVar20) & 1) &
                 *(uint *)((long)compressParams[0] +
                          (long)unscramble[uVar19] * 4 + (ulong)((uVar20 & 0xe) << 4));
        iVar13 = uVar22 + uVar4;
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        puVar9[-2] = (uint8)iVar13;
        iVar13 = uVar22 + uVar27;
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        puVar9[-1] = (uint8)iVar13;
        iVar13 = uVar22 + uVar3;
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        iVar8 = iVar26 << sVar2;
        *puVar9 = (uint8)iVar13;
        if (((uVar20 & 1) == 0) && (uVar19 == 2)) {
          puVar5[iVar8] = '\0';
          puVar9[-2] = '\0';
          puVar9[-1] = '\0';
          *puVar9 = '\0';
        }
        else {
          puVar5[iVar8] = 0xff;
        }
        lVar7 = lVar7 + 1;
        iVar26 = iVar26 + width;
        puVar9 = puVar9 + lVar18 * lVar14;
        bVar15 = bVar15 + 1;
      } while (lVar7 < starty + 3);
      iVar26 = iVar25 + 1;
      puVar9 = puVar24 + lVar14;
      bVar1 = lVar6 < startx + 3;
      lVar7 = lVar23 + -1;
      puVar24 = puVar9;
      lVar6 = lVar6 + 1;
      iVar25 = iVar26;
    } while (bVar1);
  }
  else {
    iVar26 = starty + 2;
    lVar23 = (long)iVar26 + -1;
    iVar25 = width * iVar26 + startx;
    puVar9 = img + (iVar26 * lVar18 + (long)startx) * lVar14 + 2;
    lVar7 = lVar23;
    bVar15 = 2;
    lVar6 = (long)startx;
    puVar24 = puVar9;
    iVar26 = iVar25;
    do {
      do {
        bVar16 = bVar15;
        uVar22 = uVar21 >> (bVar16 & 0x1f);
        uVar19 = (uVar22 & 1) + (uVar17 >> (bVar16 & 0x1f) & 1) * 2;
        uVar22 = -((uVar22 | uVar20) & 1) &
                 *(uint *)((long)compressParams[0] +
                          (long)unscramble[uVar19] * 4 + (ulong)((uVar20 & 0xe) << 4));
        iVar13 = uVar22 + uVar4;
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        puVar9[-2] = (uint8)iVar13;
        iVar13 = uVar22 + uVar27;
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        puVar9[-1] = (uint8)iVar13;
        iVar13 = uVar22 + uVar3;
        if (0xfe < iVar13) {
          iVar13 = 0xff;
        }
        if (iVar13 < 1) {
          iVar13 = 0;
        }
        iVar8 = iVar25 << sVar2;
        *puVar9 = (uint8)iVar13;
        if (((uVar20 & 1) == 0) && (uVar19 == 2)) {
          puVar5[iVar8] = '\0';
          puVar9[-2] = '\0';
          puVar9[-1] = '\0';
          *puVar9 = '\0';
        }
        else {
          puVar5[iVar8] = 0xff;
        }
        lVar7 = lVar7 + 1;
        iVar25 = iVar25 + width;
        puVar9 = puVar9 + lVar18 * lVar14;
        bVar15 = bVar16 + 1;
      } while (lVar7 < starty + 3);
      iVar25 = iVar26 + 1;
      puVar9 = puVar24 + lVar14;
      bVar1 = lVar6 < startx + 3;
      lVar7 = lVar23;
      bVar15 = bVar16 + 3;
      lVar6 = lVar6 + 1;
      puVar24 = puVar9;
      iVar26 = iVar25;
    } while (bVar1);
  }
  return;
}

Assistant:

void decompressBlockDifferentialWithAlphaC(unsigned int block_part1, unsigned int block_part2, uint8* img, uint8* alpha, int width, int height, int startx, int starty, int channelsRGB)
{
	
	uint8 avg_color[3], enc_color1[3], enc_color2[3];
	signed char diff[3];
	int table;
	int index,shift;
	int r,g,b;
	int diffbit;
	int flipbit;
  int channelsA;

  if(channelsRGB == 3)
  {
    // We will decode the alpha data to a separate memory area. 
    channelsA = 1;
  }
  else
  {
    // We will decode the RGB data and the alpha data to the same memory area, 
    // interleaved as RGBA. 
    channelsA = 4;
    alpha = &img[0+3];
  }

	//the diffbit now encodes whether or not the entire alpha channel is 255.
	diffbit = (GETBITSHIGH(block_part1, 1, 33));
 	flipbit = (GETBITSHIGH(block_part1, 1, 32));

	// First decode left part of block.
	enc_color1[0]= GETBITSHIGH(block_part1, 5, 63);
	enc_color1[1]= GETBITSHIGH(block_part1, 5, 55);
	enc_color1[2]= GETBITSHIGH(block_part1, 5, 47);

	// Expand from 5 to 8 bits
	avg_color[0] = (enc_color1[0] <<3) | (enc_color1[0] >> 2);
	avg_color[1] = (enc_color1[1] <<3) | (enc_color1[1] >> 2);
	avg_color[2] = (enc_color1[2] <<3) | (enc_color1[2] >> 2);

	table = GETBITSHIGH(block_part1, 3, 39) << 1;

	unsigned int pixel_indices_MSB, pixel_indices_LSB;
		
	pixel_indices_MSB = GETBITS(block_part2, 16, 31);
	pixel_indices_LSB = GETBITS(block_part2, 16, 15);

	if( (flipbit) == 0 )
	{
		// We should not flip
		shift = 0;
		for(int x=startx; x<startx+2; x++)
		{
			for(int y=starty; y<starty+4; y++)
			{
				index  = ((pixel_indices_MSB >> shift) & 1) << 1;
				index |= ((pixel_indices_LSB >> shift) & 1);
				shift++;
				index=unscramble[index];

				int mod = compressParams[table][index];
				if(diffbit==0&&(index==1||index==2)) 
				{
					mod=0;
				}
				
				r=RED_CHANNEL(img,width,x,y,channelsRGB)  =CLAMP(0,avg_color[0]+mod,255);
				g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=CLAMP(0,avg_color[1]+mod,255);
				b=BLUE_CHANNEL(img,width,x,y,channelsRGB) =CLAMP(0,avg_color[2]+mod,255);
				if(diffbit==0&&index==1) 
				{
					alpha[(y*width+x)*channelsA]=0;
					r=RED_CHANNEL(img,width,x,y,channelsRGB)=0;
					g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=0;
					b=BLUE_CHANNEL(img,width,x,y,channelsRGB)=0;
				}
				else 
				{
					alpha[(y*width+x)*channelsA]=255;
				}

			}
		}
	}
	else
	{
		// We should flip
		shift = 0;
		for(int x=startx; x<startx+4; x++)
		{
			for(int y=starty; y<starty+2; y++)
			{
				index  = ((pixel_indices_MSB >> shift) & 1) << 1;
				index |= ((pixel_indices_LSB >> shift) & 1);
				shift++;
				index=unscramble[index];
				int mod = compressParams[table][index];
				if(diffbit==0&&(index==1||index==2)) 
				{
					mod=0;
				}
				r=RED_CHANNEL(img,width,x,y,channelsRGB)  =CLAMP(0,avg_color[0]+mod,255);
				g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=CLAMP(0,avg_color[1]+mod,255);
				b=BLUE_CHANNEL(img,width,x,y,channelsRGB) =CLAMP(0,avg_color[2]+mod,255);
				if(diffbit==0&&index==1) 
				{
					alpha[(y*width+x)*channelsA]=0;
					r=RED_CHANNEL(img,width,x,y,channelsRGB)=0;
					g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=0;
					b=BLUE_CHANNEL(img,width,x,y,channelsRGB)=0;
				}
				else 
				{
					alpha[(y*width+x)*channelsA]=255;
				}
			}
			shift+=2;
		}
	}
	// Now decode right part of block. 
	diff[0]= GETBITSHIGH(block_part1, 3, 58);
	diff[1]= GETBITSHIGH(block_part1, 3, 50);
	diff[2]= GETBITSHIGH(block_part1, 3, 42);

	// Extend sign bit to entire byte. 
	diff[0] = (diff[0] << 5);
	diff[1] = (diff[1] << 5);
	diff[2] = (diff[2] << 5);
	diff[0] = diff[0] >> 5;
	diff[1] = diff[1] >> 5;
	diff[2] = diff[2] >> 5;

	//  Calculate second color
	enc_color2[0]= enc_color1[0] + diff[0];
	enc_color2[1]= enc_color1[1] + diff[1];
	enc_color2[2]= enc_color1[2] + diff[2];

	// Expand from 5 to 8 bits
	avg_color[0] = (enc_color2[0] <<3) | (enc_color2[0] >> 2);
	avg_color[1] = (enc_color2[1] <<3) | (enc_color2[1] >> 2);
	avg_color[2] = (enc_color2[2] <<3) | (enc_color2[2] >> 2);

	table = GETBITSHIGH(block_part1, 3, 36) << 1;
	pixel_indices_MSB = GETBITS(block_part2, 16, 31);
	pixel_indices_LSB = GETBITS(block_part2, 16, 15);

	if( (flipbit) == 0 )
	{
		// We should not flip
		shift=8;
		for(int x=startx+2; x<startx+4; x++)
		{
			for(int y=starty; y<starty+4; y++)
			{
				index  = ((pixel_indices_MSB >> shift) & 1) << 1;
				index |= ((pixel_indices_LSB >> shift) & 1);
				shift++;
				index=unscramble[index];
				int mod = compressParams[table][index];
				if(diffbit==0&&(index==1||index==2)) 
				{
					mod=0;
				}
				
				r=RED_CHANNEL(img,width,x,y,channelsRGB)  =CLAMP(0,avg_color[0]+mod,255);
				g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=CLAMP(0,avg_color[1]+mod,255);
				b=BLUE_CHANNEL(img,width,x,y,channelsRGB) =CLAMP(0,avg_color[2]+mod,255);
				if(diffbit==0&&index==1) 
				{
					alpha[(y*width+x)*channelsA]=0;
					r=RED_CHANNEL(img,width,x,y,channelsRGB)=0;
					g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=0;
					b=BLUE_CHANNEL(img,width,x,y,channelsRGB)=0;
				}
				else 
				{
					alpha[(y*width+x)*channelsA]=255;
				}
			}
		}
	}
	else
	{
		// We should flip
		shift=2;
		for(int x=startx; x<startx+4; x++)
		{
			for(int y=starty+2; y<starty+4; y++)
			{
				index  = ((pixel_indices_MSB >> shift) & 1) << 1;
				index |= ((pixel_indices_LSB >> shift) & 1);
				shift++;
				index=unscramble[index];
				int mod = compressParams[table][index];
				if(diffbit==0&&(index==1||index==2)) 
				{
					mod=0;
				}
				
				r=RED_CHANNEL(img,width,x,y,channelsRGB)  =CLAMP(0,avg_color[0]+mod,255);
				g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=CLAMP(0,avg_color[1]+mod,255);
				b=BLUE_CHANNEL(img,width,x,y,channelsRGB) =CLAMP(0,avg_color[2]+mod,255);
				if(diffbit==0&&index==1) 
				{
					alpha[(y*width+x)*channelsA]=0;
					r=RED_CHANNEL(img,width,x,y,channelsRGB)=0;
					g=GREEN_CHANNEL(img,width,x,y,channelsRGB)=0;
					b=BLUE_CHANNEL(img,width,x,y,channelsRGB)=0;
				}
				else 
				{
					alpha[(y*width+x)*channelsA]=255;
				}
			}
			shift += 2;
		}
	}
}